

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar5.c
# Opt level: O2

wchar_t parse_htime_item(archive_read *a,char unix_time,uint64_t *where,ssize_t *extra_data_size)

{
  ulong uVar1;
  wchar_t wVar2;
  uchar *p;
  ulong uVar3;
  uint32_t time_val;
  ulong *local_28;
  
  if (unix_time == '\0') {
    wVar2 = read_ahead(a,8,(uint8_t **)&local_28);
    uVar3 = (ulong)(uint)wVar2;
    if (wVar2 != L'\0') {
      uVar1 = *local_28;
      wVar2 = consume(a,8);
      uVar3 = (ulong)(uint)wVar2;
      if (wVar2 == L'\0') {
        uVar3 = uVar1 / 10000000;
        *where = uVar3 - 0x2b6109100;
        *extra_data_size = *extra_data_size + -8;
      }
    }
  }
  else {
    wVar2 = read_u32(a,&time_val);
    uVar3 = (ulong)(uint)wVar2;
    if (wVar2 != L'\0') {
      *extra_data_size = *extra_data_size + -4;
      uVar3 = (ulong)time_val;
      *where = uVar3;
    }
  }
  return (wchar_t)uVar3;
}

Assistant:

static int parse_htime_item(struct archive_read* a, char unix_time,
    uint64_t* where, ssize_t* extra_data_size)
{
	if(unix_time) {
		uint32_t time_val;
		if(!read_u32(a, &time_val))
			return ARCHIVE_EOF;

		*extra_data_size -= 4;
		*where = (uint64_t) time_val;
	} else {
		uint64_t windows_time;
		if(!read_u64(a, &windows_time))
			return ARCHIVE_EOF;

		*where = time_win_to_unix(windows_time);
		*extra_data_size -= 8;
	}

	return ARCHIVE_OK;
}